

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

size_t release_unused_segments(mstate m)

{
  tbinptr pmVar1;
  long *plVar2;
  char *__addr;
  size_t __len;
  malloc_segment *pmVar3;
  malloc_tree_chunk *pmVar4;
  tbinptr pmVar5;
  tbinptr pmVar6;
  byte bVar7;
  long lVar8;
  malloc_tree_chunk **ppmVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  malloc_tree_chunk *pmVar14;
  tbinptr pmVar15;
  long lVar16;
  ulong uVar17;
  size_t sVar18;
  malloc_tree_chunk **ppmVar19;
  uint uVar20;
  malloc_segment *pmVar21;
  malloc_segment *local_58;
  
  uVar20 = 0;
  sVar18 = 0;
  pmVar3 = (m->seg).next;
  pmVar21 = &m->seg;
LAB_00150ac9:
  do {
    do {
      do {
        local_58 = pmVar21;
        pmVar21 = pmVar3;
        if (pmVar21 == (malloc_segment *)0x0) {
          uVar12 = 0xfff;
          if (0xfff < uVar20) {
            uVar12 = (ulong)uVar20;
          }
          m->release_checks = uVar12;
          return sVar18;
        }
        __addr = pmVar21->base;
        __len = pmVar21->size;
        pmVar3 = pmVar21->next;
        uVar20 = uVar20 + 1;
      } while ((pmVar21->sflags & 9) != 1);
      uVar12 = (ulong)(-(int)__addr - 0x10U & 0xf);
      pmVar1 = (tbinptr)(__addr + uVar12);
      uVar12 = *(ulong *)(__addr + uVar12 + 8);
      uVar17 = uVar12 & 0xfffffffffffffff8;
    } while ((((uint)uVar12 & 3) != 1) ||
            ((char *)((long)pmVar1->child + (uVar17 - 0x20)) < __addr + (__len - 0x50)));
    if (pmVar1 == (tbinptr)m->dv) {
      m->dv = (mchunkptr)0x0;
      m->dvsize = 0;
    }
    else {
      pmVar15 = pmVar1->bk;
      pmVar4 = pmVar1->child[2];
      if (pmVar15 == pmVar1) {
        if (pmVar1->child[1] == (tbinptr)0x0) {
          if (pmVar1->child[0] == (tbinptr)0x0) {
            pmVar15 = (tbinptr)0x0;
            goto LAB_00150bd3;
          }
          pmVar5 = pmVar1->child[0];
          ppmVar9 = pmVar1->child;
        }
        else {
          pmVar5 = pmVar1->child[1];
          ppmVar9 = pmVar1->child + 1;
        }
        do {
          do {
            ppmVar19 = ppmVar9;
            pmVar15 = pmVar5;
            pmVar5 = pmVar15->child[1];
            ppmVar9 = pmVar15->child + 1;
          } while (pmVar15->child[1] != (malloc_tree_chunk *)0x0);
          pmVar5 = pmVar15->child[0];
          ppmVar9 = pmVar15->child;
        } while (pmVar15->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar19 < m->least_addr) goto LAB_00150e06;
        *ppmVar19 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar14 = pmVar1->fd;
        if (((pmVar14 < (malloc_tree_chunk *)m->least_addr) || (pmVar14->bk != pmVar1)) ||
           (pmVar15->fd != pmVar1)) goto LAB_00150e06;
        pmVar14->bk = pmVar15;
        pmVar15->fd = pmVar14;
      }
LAB_00150bd3:
      if (pmVar4 != (malloc_tree_chunk *)0x0) {
        uVar13 = *(uint *)(pmVar1->child + 3);
        if (pmVar1 == m->treebins[uVar13]) {
          m->treebins[uVar13] = pmVar15;
          if (pmVar15 == (tbinptr)0x0) {
            bVar7 = (byte)uVar13 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
          }
          else {
LAB_00150c13:
            pmVar5 = (tbinptr)m->least_addr;
            if (pmVar15 < pmVar5) goto LAB_00150e06;
            pmVar15->child[2] = pmVar4;
            pmVar6 = pmVar1->child[0];
            if (pmVar6 != (tbinptr)0x0) {
              if (pmVar6 < pmVar5) goto LAB_00150e06;
              pmVar15->child[0] = pmVar6;
              pmVar6->child[2] = pmVar15;
            }
            pmVar4 = pmVar1->child[1];
            if (pmVar4 != (malloc_tree_chunk *)0x0) {
              if (pmVar4 < (malloc_tree_chunk *)m->least_addr) goto LAB_00150e06;
              pmVar15->child[1] = pmVar4;
              pmVar4->parent = pmVar15;
            }
          }
        }
        else {
          if (pmVar4 < (malloc_tree_chunk *)m->least_addr) goto LAB_00150e06;
          pmVar4->child[pmVar4->child[0] != pmVar1] = pmVar15;
          if (pmVar15 != (tbinptr)0x0) goto LAB_00150c13;
        }
      }
    }
    iVar10 = munmap(__addr,__len);
    if (iVar10 == 0) {
      m->footprint = m->footprint - __len;
      sVar18 = sVar18 + __len;
      local_58->next = pmVar3;
      pmVar21 = local_58;
      goto LAB_00150ac9;
    }
    uVar13 = (uint)(uVar12 >> 8);
    if (uVar13 == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0x1f;
      if (uVar13 < 0x10000) {
        uVar11 = ((uint)(uVar17 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar13)) & 0x3f)) & 1) +
                 LZCOUNT(uVar13) * 2 ^ 0x3e;
      }
    }
    *(uint *)(pmVar1->child + 3) = uVar11;
    pmVar4 = (malloc_tree_chunk *)(m->treebins + uVar11);
    pmVar1->child[0] = (malloc_tree_chunk *)0x0;
    pmVar1->child[1] = (malloc_tree_chunk *)0x0;
    if ((m->treemap >> (uVar11 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << (uVar11 & 0x1f);
      pmVar4->prev_foot = (size_t)pmVar1;
      pmVar1->child[2] = pmVar4;
    }
    else {
      uVar12 = (ulong)(byte)(0x39 - (char)(uVar11 >> 1));
      if (uVar11 == 0x1f) {
        uVar12 = 0;
      }
      lVar16 = uVar17 << (uVar12 & 0x3f);
      pmVar4 = (malloc_tree_chunk *)pmVar4->prev_foot;
      do {
        pmVar14 = pmVar4;
        if ((pmVar14->head & 0xfffffffffffffff8) == uVar17) {
          if ((pmVar14 < (malloc_tree_chunk *)m->least_addr) ||
             (pmVar4 = pmVar14->fd, pmVar4 < (malloc_tree_chunk *)m->least_addr)) goto LAB_00150e06;
          pmVar4->bk = pmVar1;
          pmVar14->fd = pmVar1;
          pmVar1->fd = pmVar4;
          pmVar1->bk = pmVar14;
          pmVar1->child[2] = (malloc_tree_chunk *)0x0;
          goto LAB_00150ac9;
        }
        lVar8 = lVar16 >> 0x3f;
        lVar16 = lVar16 * 2;
        pmVar4 = *(malloc_tree_chunk **)((long)pmVar14 + lVar8 * -8 + 0x20);
      } while (pmVar4 != (malloc_tree_chunk *)0x0);
      plVar2 = (long *)((long)pmVar14 + lVar8 * -8 + 0x20);
      if (plVar2 < m->least_addr) {
LAB_00150e06:
        abort();
      }
      *plVar2 = (long)pmVar1;
      pmVar1->child[2] = pmVar14;
    }
    pmVar1->bk = pmVar1;
    pmVar1->fd = pmVar1;
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m) {
  size_t released = 0;
  int nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char* base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    ++nsegs;
    if (is_mmapped_segment(sp) && !is_extern_segment(sp)) {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!is_inuse(p) && (char*)p + psize >= base + size - TOP_FOOT_SIZE) {
        tchunkptr tp = (tchunkptr)p;
        assert(segment_holds(sp, (char*)sp));
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        else {
          unlink_large_chunk(m, tp);
        }
        if (CALL_MUNMAP(base, size) == 0) {
          released += size;
          m->footprint -= size;
          /* unlink obsoleted record */
          sp = pred;
          sp->next = next;
        }
        else { /* back out if cannot unmap */
          insert_large_chunk(m, tp, psize);
        }
      }
    }
    if (NO_SEGMENT_TRAVERSAL) /* scan only first segment */
      break;
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = (((size_t) nsegs > (size_t) MAX_RELEASE_CHECK_RATE)?
                       (size_t) nsegs : (size_t) MAX_RELEASE_CHECK_RATE);
  return released;
}